

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ur_kin.cpp
# Opt level: O2

int ur_kinematics::inverse(double *T,double *q_sols,double q6_des)

{
  double dVar1;
  ulong uVar2;
  double *pdVar3;
  long lVar4;
  int iVar5;
  int j;
  long lVar6;
  long lVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  ulong extraout_XMM0_Qb;
  ulong extraout_XMM0_Qb_00;
  undefined4 uVar12;
  undefined4 uVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double __x;
  double q4 [2];
  double q2 [2];
  double q3 [2];
  double q5 [2] [2];
  double local_1b8 [4];
  double local_198;
  double local_190;
  double local_188;
  ulong uStack_180;
  double local_178;
  ulong uStack_170;
  double local_168;
  ulong uStack_160;
  double local_158;
  ulong uStack_150;
  double local_148;
  ulong uStack_140;
  double local_138 [5];
  double local_110;
  double local_108;
  double local_100;
  double local_f8;
  ulong uStack_f0;
  double local_e8;
  ulong uStack_e0;
  double local_d8;
  undefined8 uStack_d0;
  double local_c8;
  ulong uStack_c0;
  undefined1 local_b8 [16];
  double local_a8 [3];
  ulong uStack_90;
  undefined1 local_88 [16];
  double local_78;
  ulong uStack_70;
  double local_68;
  ulong uStack_60;
  double local_58;
  undefined8 uStack_50;
  double local_48 [4];
  
  local_148 = *T;
  local_198 = T[1];
  local_1b8[3] = T[2];
  local_188 = T[3];
  local_158 = T[4];
  local_d8 = T[5];
  uStack_d0 = 0;
  local_e8 = T[6];
  uStack_e0 = 0;
  dVar1 = T[7];
  uStack_150 = 0;
  dVar18 = dVar1 - local_158 * 0.0921;
  uStack_140 = 0;
  uStack_180 = 0;
  dVar17 = local_188 - local_148 * 0.0921;
  local_168 = T[8];
  uStack_160 = 0;
  local_178 = T[9];
  uStack_170 = 0;
  local_f8 = T[10];
  uStack_f0 = 0;
  dVar14 = T[0xb];
  local_110 = q6_des;
  if (1e-08 <= ABS(dVar18)) {
    if (1e-08 <= ABS(dVar17)) {
      dVar8 = dVar18 * dVar18 + dVar17 * dVar17;
      if (dVar8 < 0.0171741025) {
        return 0;
      }
      dVar8 = acos(0.13105 / SQRT(dVar8));
      dVar17 = atan2(-dVar17,dVar18);
      dVar18 = (double)(~-(ulong)(ABS(dVar8 + dVar17) < 1e-08) & (ulong)(dVar8 + dVar17));
      local_1b8[1] = (double)(~-(ulong)(ABS(dVar17 - dVar8) < 1e-08) & (ulong)(dVar17 - dVar8));
      local_1b8[0] = (double)(~-(ulong)(dVar18 < 0.0) & (ulong)dVar18 |
                             (ulong)(dVar18 + 6.28318530717958) & -(ulong)(dVar18 < 0.0));
      if (local_1b8[1] < 0.0) {
        local_1b8[1] = local_1b8[1] + 6.28318530717958;
      }
    }
    else {
      if (1e-08 <= ABS(0.13105 - ABS(dVar18))) {
        dVar18 = 0.13105 / dVar18;
      }
      else {
        dVar18 = (double)(int)((uint)(0.0 < dVar18) - (uint)(dVar18 < 0.0));
      }
      local_1b8[0] = acos(dVar18);
      local_1b8[1] = 6.28318530717958 - local_1b8[0];
    }
  }
  else {
    if (1e-08 <= ABS(0.13105 - ABS(dVar17))) {
      dVar17 = -0.13105 / dVar17;
    }
    else {
      dVar17 = (double)(int)((uint)(dVar17 < 0.0) - (uint)(0.0 < dVar17));
    }
    local_1b8[1] = asin(dVar17);
    local_1b8[1] = (double)(~-(ulong)(ABS(local_1b8[1]) < 1e-08) & (ulong)local_1b8[1]);
    local_1b8[0] = (double)(~-(ulong)(local_1b8[1] < 0.0) & (ulong)local_1b8[1] |
                           (ulong)(local_1b8[1] + 6.28318530717958) & -(ulong)(local_1b8[1] < 0.0));
    local_1b8[1] = 3.14159265358979 - local_1b8[1];
  }
  local_148 = -local_148;
  uStack_140 = uStack_140 ^ 0x8000000000000000;
  local_188 = -local_188;
  uStack_180 = uStack_180 ^ 0x8000000000000000;
  local_158 = -local_158;
  uStack_150 = uStack_150 ^ 0x8000000000000000;
  local_58 = -dVar1;
  uStack_50 = 0x8000000000000000;
  local_178 = -local_178;
  uStack_170 = uStack_170 ^ 0x8000000000000000;
  local_68 = -local_f8;
  uStack_60 = uStack_f0 ^ 0x8000000000000000;
  for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 8) {
    dVar17 = *(double *)((long)local_1b8 + lVar7);
    dVar18 = sin(dVar17);
    dVar17 = cos(dVar17);
    dVar17 = dVar18 * local_188 + dVar17 * dVar1 + -0.13105;
    if (1e-08 <= ABS(ABS(dVar17) + -0.0921)) {
      dVar17 = dVar17 / 0.0921;
    }
    else {
      dVar17 = (double)(int)((uint)(0.0 < dVar17) - (uint)(dVar17 < 0.0));
    }
    dVar17 = acos(dVar17);
    *(double *)((long)local_48 + lVar7 * 2) = dVar17;
    *(double *)((long)local_48 + lVar7 * 2 + 8) = 6.28318530717958 - dVar17;
  }
  local_78 = -local_168;
  uStack_70 = uStack_160 ^ 0x8000000000000000;
  local_168 = local_168 * -0.0921 + dVar14 + -0.15185;
  local_a8[2] = -local_e8;
  uStack_90 = uStack_e0 ^ 0x8000000000000000;
  local_88._8_4_ = (int)uStack_d0;
  local_88._0_8_ = -local_d8;
  local_88._12_4_ = (uint)((ulong)uStack_d0 >> 0x20) ^ 0x80000000;
  lVar7 = 0;
  iVar5 = 0;
  do {
    if (lVar7 == 2) {
      return iVar5;
    }
    dVar1 = local_1b8[lVar7];
    for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
      dVar17 = cos(dVar1);
      dVar18 = sin(dVar1);
      local_190 = local_48[lVar7 * 2 + lVar6];
      dVar8 = cos(local_190);
      dVar9 = sin(local_190);
      uVar12 = 0;
      uVar13 = 0;
      dVar14 = local_110;
      if (1e-08 <= ABS(dVar9)) {
        dVar14 = (double)(int)((uint)(0.0 < dVar9) - (uint)(dVar9 < 0.0));
        dVar14 = atan2(-(local_1b8[3] * dVar18 + dVar17 * local_a8[2]) * dVar14,
                       (local_198 * dVar18 + dVar17 * (double)local_88._0_8_) * dVar14);
        dVar14 = (double)(~-(ulong)(ABS(dVar14) < 1e-08) & (ulong)dVar14);
        uVar2 = ~(extraout_XMM0_Qb_00 & 0x7fffffffffffffff) & extraout_XMM0_Qb_00;
        uVar12 = (undefined4)uVar2;
        uVar13 = (undefined4)(uVar2 >> 0x20);
        if (dVar14 < 0.0) {
          dVar14 = dVar14 + 6.28318530717958;
        }
      }
      local_b8._8_4_ = uVar12;
      local_b8._0_8_ = dVar14;
      local_b8._12_4_ = uVar13;
      dVar10 = cos(dVar14);
      dVar11 = sin((double)local_b8._0_8_);
      dVar14 = local_148 * dVar17 + dVar18 * local_158;
      dVar15 = local_1b8[3] * dVar17 + local_e8 * dVar18;
      dVar16 = local_198 * dVar17 + local_d8 * dVar18;
      dVar18 = dVar18 * local_58 +
               dVar17 * local_188 + (dVar11 * dVar16 + dVar15 * dVar10) * 0.08535 + dVar14 * -0.0921
      ;
      dVar17 = (local_68 * dVar10 + dVar11 * local_178) * 0.08535 + local_168;
      __x = (dVar18 * dVar18 + dVar17 * dVar17 + -0.059316602499999996 + -0.04545424) /
            0.10384971999999999;
      if (1e-08 <= ABS(ABS(__x) + -1.0)) {
        if (ABS(__x) <= 1.0) goto LAB_001161ae;
      }
      else {
        __x = (double)(int)((uint)(0.0 < __x) - (uint)(__x < 0.0));
LAB_001161ae:
        uStack_c0 = extraout_XMM0_Qb ^ 0x8000000000000000;
        local_c8 = -dVar9 * dVar14 - (dVar15 * dVar11 - dVar16 * dVar10) * dVar8;
        dVar11 = (dVar10 * local_178 + dVar11 * local_f8) * dVar8 + dVar9 * local_78;
        dVar14 = acos(__x);
        dVar8 = __x * 0.10384971999999999 + 0.10477084249999999;
        local_a8[0] = dVar14;
        local_a8[1] = 6.28318530717958 - dVar14;
        dVar9 = sin(dVar14);
        dVar10 = __x * -0.2132 + -0.24355;
        local_108 = dVar18 * dVar9 * -0.2132;
        local_100 = dVar10 * dVar17;
        dVar17 = dVar9 * -0.2132 * dVar17;
        dVar10 = dVar10 * dVar18;
        dVar18 = atan2((local_100 - local_108) / dVar8,(dVar10 + dVar17) / dVar8);
        local_138[2] = dVar18;
        dVar8 = atan2((local_100 + local_108) / dVar8,(dVar10 - dVar17) / dVar8);
        local_138[3] = dVar8;
        dVar17 = cos(dVar14 + dVar18);
        dVar18 = sin(dVar14 + dVar18);
        dVar8 = (6.28318530717958 - dVar14) + dVar8;
        dVar14 = cos(dVar8);
        dVar8 = sin(dVar8);
        local_138[0] = atan2(dVar17 * dVar11 - local_c8 * dVar18,dVar18 * dVar11 + local_c8 * dVar17
                            );
        local_138[1] = atan2(dVar14 * dVar11 - local_c8 * dVar8,dVar11 * dVar8 + local_c8 * dVar14);
        pdVar3 = q_sols + (long)iVar5 * 6 + 5;
        for (lVar4 = 0; lVar4 != 2; lVar4 = lVar4 + 1) {
          dVar14 = local_138[lVar4 + 2];
          dVar17 = 0.0;
          if (ABS(dVar14) < 1e-08) {
LAB_001164cb:
            dVar14 = dVar17;
            local_138[lVar4 + 2] = dVar14;
          }
          else if (dVar14 < 0.0) {
            dVar17 = dVar14 + 6.28318530717958;
            goto LAB_001164cb;
          }
          dVar17 = local_138[lVar4];
          uVar12 = SUB84(dVar17,0);
          uVar13 = (undefined4)((ulong)dVar17 >> 0x20);
          dVar18 = 0.0;
          if (ABS(dVar17) < 1e-08) {
LAB_00116502:
            local_138[lVar4] = dVar18;
            uVar12 = SUB84(dVar18,0);
            uVar13 = (undefined4)((ulong)dVar18 >> 0x20);
          }
          else if (dVar17 < 0.0) {
            dVar18 = dVar17 + 6.28318530717958;
            goto LAB_00116502;
          }
          pdVar3[-5] = dVar1;
          pdVar3[-4] = dVar14;
          pdVar3[-3] = local_a8[lVar4];
          pdVar3[-2] = (double)CONCAT44(uVar13,uVar12);
          pdVar3[-1] = local_190;
          *pdVar3 = (double)local_b8._0_8_;
          pdVar3 = pdVar3 + 6;
        }
        iVar5 = iVar5 + 2;
      }
    }
    lVar7 = lVar7 + 1;
  } while( true );
}

Assistant:

int inverse(const double* T, double* q_sols, double q6_des) {
    int num_sols = 0;
    double T02 = -*T; T++; double T00 =  *T; T++; double T01 =  *T; T++; double T03 = -*T; T++;
    double T12 = -*T; T++; double T10 =  *T; T++; double T11 =  *T; T++; double T13 = -*T; T++;
    double T22 =  *T; T++; double T20 = -*T; T++; double T21 = -*T; T++; double T23 =  *T;

    ////////////////////////////// shoulder rotate joint (q1) //////////////////////////////
    double q1[2];
    {
      double A = d6*T12 - T13;
      double B = d6*T02 - T03;
      double R = A*A + B*B;
      if(fabs(A) < ZERO_THRESH) {
        double div;
        if(fabs(fabs(d4) - fabs(B)) < ZERO_THRESH)
          div = -SIGN(d4)*SIGN(B);
        else
          div = -d4/B;
        double arcsin = asin(div);
        if(fabs(arcsin) < ZERO_THRESH)
          arcsin = 0.0;
        if(arcsin < 0.0)
          q1[0] = arcsin + 2.0*IKPI;
        else
          q1[0] = arcsin;
        q1[1] = IKPI - arcsin;
      }
      else if(fabs(B) < ZERO_THRESH) {
        double div;
        if(fabs(fabs(d4) - fabs(A)) < ZERO_THRESH)
          div = SIGN(d4)*SIGN(A);
        else
          div = d4/A;
        double arccos = acos(div);
        q1[0] = arccos;
        q1[1] = 2.0*IKPI - arccos;
      }
      else if(d4*d4 > R) {
        return num_sols;
      }
      else {
        double arccos = acos(d4 / sqrt(R)) ;
        double arctan = atan2(-B, A);
        double pos = arccos + arctan;
        double neg = -arccos + arctan;
        if(fabs(pos) < ZERO_THRESH)
          pos = 0.0;
        if(fabs(neg) < ZERO_THRESH)
          neg = 0.0;
        if(pos >= 0.0)
          q1[0] = pos;
        else
          q1[0] = 2.0*IKPI + pos;
        if(neg >= 0.0)
          q1[1] = neg;
        else
          q1[1] = 2.0*IKPI + neg;
      }
    }
    ////////////////////////////////////////////////////////////////////////////////

    ////////////////////////////// wrist 2 joint (q5) //////////////////////////////
    double q5[2][2];
    {
      for(int i=0;i<2;i++) {
        double numer = (T03*sin(q1[i]) - T13*cos(q1[i])-d4);
        double div;
        if(fabs(fabs(numer) - fabs(d6)) < ZERO_THRESH)
          div = SIGN(numer) * SIGN(d6);
        else
          div = numer / d6;
        double arccos = acos(div);
        q5[i][0] = arccos;
        q5[i][1] = 2.0*IKPI - arccos;
      }
    }
    ////////////////////////////////////////////////////////////////////////////////

    {
      for(int i=0;i<2;i++) {
        for(int j=0;j<2;j++) {
          double c1 = cos(q1[i]), s1 = sin(q1[i]);
          double c5 = cos(q5[i][j]), s5 = sin(q5[i][j]);
          double q6;
          ////////////////////////////// wrist 3 joint (q6) //////////////////////////////
          if(fabs(s5) < ZERO_THRESH)
            q6 = q6_des;
          else {
            q6 = atan2(SIGN(s5)*-(T01*s1 - T11*c1),
                       SIGN(s5)*(T00*s1 - T10*c1));
            if(fabs(q6) < ZERO_THRESH)
              q6 = 0.0;
            if(q6 < 0.0)
              q6 += 2.0*IKPI;
          }
          ////////////////////////////////////////////////////////////////////////////////

          double q2[2], q3[2], q4[2];
          ///////////////////////////// RRR joints (q2,q3,q4) ////////////////////////////
          double c6 = cos(q6), s6 = sin(q6);
          double x04x = -s5*(T02*c1 + T12*s1) - c5*(s6*(T01*c1 + T11*s1) - c6*(T00*c1 + T10*s1));
          double x04y = c5*(T20*c6 - T21*s6) - T22*s5;
          double p13x = d5*(s6*(T00*c1 + T10*s1) + c6*(T01*c1 + T11*s1)) - d6*(T02*c1 + T12*s1) +
                        T03*c1 + T13*s1;
          double p13y = T23 - d1 - d6*T22 + d5*(T21*c6 + T20*s6);

          double c3 = (p13x*p13x + p13y*p13y - a2*a2 - a3*a3) / (2.0*a2*a3);
          if(fabs(fabs(c3) - 1.0) < ZERO_THRESH)
            c3 = SIGN(c3);
          else if(fabs(c3) > 1.0) {
            // TODO NO SOLUTION
            continue;
          }
          double arccos = acos(c3);
          q3[0] = arccos;
          q3[1] = 2.0*IKPI - arccos;
          double denom = a2*a2 + a3*a3 + 2*a2*a3*c3;
          double s3 = sin(arccos);
          double A = (a2 + a3*c3), B = a3*s3;
          q2[0] = atan2((A*p13y - B*p13x) / denom, (A*p13x + B*p13y) / denom);
          q2[1] = atan2((A*p13y + B*p13x) / denom, (A*p13x - B*p13y) / denom);
          double c23_0 = cos(q2[0]+q3[0]);
          double s23_0 = sin(q2[0]+q3[0]);
          double c23_1 = cos(q2[1]+q3[1]);
          double s23_1 = sin(q2[1]+q3[1]);
          q4[0] = atan2(c23_0*x04y - s23_0*x04x, x04x*c23_0 + x04y*s23_0);
          q4[1] = atan2(c23_1*x04y - s23_1*x04x, x04x*c23_1 + x04y*s23_1);
          ////////////////////////////////////////////////////////////////////////////////
          for(int k=0;k<2;k++) {
            if(fabs(q2[k]) < ZERO_THRESH)
              q2[k] = 0.0;
            else if(q2[k] < 0.0) q2[k] += 2.0*IKPI;
            if(fabs(q4[k]) < ZERO_THRESH)
              q4[k] = 0.0;
            else if(q4[k] < 0.0) q4[k] += 2.0*IKPI;
            q_sols[num_sols*6+0] = q1[i];    q_sols[num_sols*6+1] = q2[k];
            q_sols[num_sols*6+2] = q3[k];    q_sols[num_sols*6+3] = q4[k];
            q_sols[num_sols*6+4] = q5[i][j]; q_sols[num_sols*6+5] = q6;
            num_sols++;
          }

        }
      }
    }
    return num_sols;
  }